

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O0

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_0> *alhs,
          const_blas_data_mapper<double,_long,_1> *rhs,ResScalar *res,long resIncr,double alpha)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  double *pdVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dc_39;
  undefined4 extraout_XMM0_Dc_40;
  undefined4 extraout_XMM0_Dc_41;
  undefined4 extraout_XMM0_Dc_42;
  undefined4 extraout_XMM0_Dc_43;
  undefined4 extraout_XMM0_Dc_44;
  undefined4 extraout_XMM0_Dc_45;
  undefined4 extraout_XMM0_Dc_46;
  undefined4 extraout_XMM0_Dc_47;
  undefined4 extraout_XMM0_Dc_48;
  undefined4 extraout_XMM0_Dc_49;
  undefined4 extraout_XMM0_Dc_50;
  undefined4 extraout_XMM0_Dc_51;
  undefined4 extraout_XMM0_Dc_52;
  undefined4 extraout_XMM0_Dc_53;
  undefined4 extraout_XMM0_Dc_54;
  undefined4 extraout_XMM0_Dc_55;
  undefined4 extraout_XMM0_Dc_56;
  undefined4 extraout_XMM0_Dc_57;
  undefined4 extraout_XMM0_Dc_58;
  undefined4 extraout_XMM0_Dc_59;
  undefined4 extraout_XMM0_Dc_60;
  undefined4 extraout_XMM0_Dc_61;
  undefined4 extraout_XMM0_Dc_62;
  undefined4 extraout_XMM0_Dc_63;
  undefined4 extraout_XMM0_Dc_64;
  undefined4 extraout_XMM0_Dc_65;
  undefined4 extraout_XMM0_Dc_66;
  undefined4 extraout_XMM0_Dc_67;
  undefined4 extraout_XMM0_Dc_68;
  undefined4 extraout_XMM0_Dc_69;
  undefined4 extraout_XMM0_Dc_70;
  undefined4 extraout_XMM0_Dc_71;
  undefined4 extraout_XMM0_Dc_72;
  undefined4 extraout_XMM0_Dc_73;
  undefined4 extraout_XMM0_Dc_74;
  undefined4 extraout_XMM0_Dc_75;
  undefined4 extraout_XMM0_Dc_76;
  undefined4 extraout_XMM0_Dc_77;
  undefined4 extraout_XMM0_Dc_78;
  undefined4 extraout_XMM0_Dc_79;
  undefined4 extraout_XMM0_Dc_80;
  undefined4 extraout_XMM0_Dc_81;
  undefined4 extraout_XMM0_Dc_82;
  undefined4 extraout_XMM0_Dc_83;
  undefined4 extraout_XMM0_Dc_84;
  undefined4 extraout_XMM0_Dc_85;
  undefined4 extraout_XMM0_Dc_86;
  undefined4 extraout_XMM0_Dc_87;
  undefined4 extraout_XMM0_Dc_88;
  undefined4 extraout_XMM0_Dc_89;
  undefined4 extraout_XMM0_Dc_90;
  undefined4 extraout_XMM0_Dc_91;
  undefined4 extraout_XMM0_Dc_92;
  undefined4 extraout_XMM0_Dc_93;
  undefined4 extraout_XMM0_Dc_94;
  undefined4 extraout_XMM0_Dc_95;
  undefined4 extraout_XMM0_Dc_96;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined4 extraout_XMM0_Dd_22;
  undefined4 extraout_XMM0_Dd_23;
  undefined4 extraout_XMM0_Dd_24;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined4 extraout_XMM0_Dd_35;
  undefined4 extraout_XMM0_Dd_36;
  undefined4 extraout_XMM0_Dd_37;
  undefined4 extraout_XMM0_Dd_38;
  undefined4 extraout_XMM0_Dd_39;
  undefined4 extraout_XMM0_Dd_40;
  undefined4 extraout_XMM0_Dd_41;
  undefined4 extraout_XMM0_Dd_42;
  undefined4 extraout_XMM0_Dd_43;
  undefined4 extraout_XMM0_Dd_44;
  undefined4 extraout_XMM0_Dd_45;
  undefined4 extraout_XMM0_Dd_46;
  undefined4 extraout_XMM0_Dd_47;
  undefined4 extraout_XMM0_Dd_48;
  undefined4 extraout_XMM0_Dd_49;
  undefined4 extraout_XMM0_Dd_50;
  undefined4 extraout_XMM0_Dd_51;
  undefined4 extraout_XMM0_Dd_52;
  undefined4 extraout_XMM0_Dd_53;
  undefined4 extraout_XMM0_Dd_54;
  undefined4 extraout_XMM0_Dd_55;
  undefined4 extraout_XMM0_Dd_56;
  undefined4 extraout_XMM0_Dd_57;
  undefined4 extraout_XMM0_Dd_58;
  undefined4 extraout_XMM0_Dd_59;
  undefined4 extraout_XMM0_Dd_60;
  undefined4 extraout_XMM0_Dd_61;
  undefined4 extraout_XMM0_Dd_62;
  undefined4 extraout_XMM0_Dd_63;
  undefined4 extraout_XMM0_Dd_64;
  undefined4 extraout_XMM0_Dd_65;
  undefined4 extraout_XMM0_Dd_66;
  undefined4 extraout_XMM0_Dd_67;
  undefined4 extraout_XMM0_Dd_68;
  undefined4 extraout_XMM0_Dd_69;
  undefined4 extraout_XMM0_Dd_70;
  undefined4 extraout_XMM0_Dd_71;
  undefined4 extraout_XMM0_Dd_72;
  undefined4 extraout_XMM0_Dd_73;
  undefined4 extraout_XMM0_Dd_74;
  undefined4 extraout_XMM0_Dd_75;
  undefined4 extraout_XMM0_Dd_76;
  undefined4 extraout_XMM0_Dd_77;
  undefined4 extraout_XMM0_Dd_78;
  undefined4 extraout_XMM0_Dd_79;
  undefined4 extraout_XMM0_Dd_80;
  undefined4 extraout_XMM0_Dd_81;
  undefined4 extraout_XMM0_Dd_82;
  undefined4 extraout_XMM0_Dd_83;
  undefined4 extraout_XMM0_Dd_84;
  undefined4 extraout_XMM0_Dd_85;
  undefined4 extraout_XMM0_Dd_86;
  undefined4 extraout_XMM0_Dd_87;
  undefined4 extraout_XMM0_Dd_88;
  undefined4 extraout_XMM0_Dd_89;
  undefined4 extraout_XMM0_Dd_90;
  undefined4 extraout_XMM0_Dd_91;
  undefined4 extraout_XMM0_Dd_92;
  undefined4 extraout_XMM0_Dd_93;
  undefined4 extraout_XMM0_Dd_94;
  undefined4 extraout_XMM0_Dd_95;
  undefined4 extraout_XMM0_Dd_96;
  Packet2d adVar11;
  double adVar12 [2];
  const_blas_data_mapper<double,_long,_0> *local_ba0;
  long local_b98;
  long j_5;
  ResScalar c0_5;
  Packet2d local_b78;
  double local_b68 [2];
  undefined1 auStack_b58 [8];
  RhsPacket b0_4;
  long j_4;
  undefined1 auStack_b38 [8];
  ResPacket c0_4;
  Packet2d local_b18;
  double local_b08 [2];
  Packet2d local_af8;
  double local_ae8 [2];
  double local_ad8 [2];
  undefined1 auStack_ac8 [8];
  RhsPacket b0_3;
  long j_3;
  undefined1 auStack_aa8 [8];
  ResPacket c1_3;
  double local_a90;
  undefined1 auStack_a88 [8];
  ResPacket c0_3;
  Packet2d local_a68;
  double local_a58 [2];
  Packet2d local_a48;
  double local_a38 [2];
  Packet2d local_a28;
  double local_a18 [2];
  double local_a08 [2];
  double local_9f8 [2];
  undefined1 auStack_9e8 [8];
  RhsPacket b0_2;
  long j_2;
  undefined1 auStack_9c8 [8];
  ResPacket c2_2;
  double local_9b0;
  undefined1 auStack_9a8 [8];
  ResPacket c1_2;
  double local_990;
  undefined1 auStack_988 [8];
  ResPacket c0_2;
  Packet2d local_968;
  double local_958 [2];
  Packet2d local_948;
  double local_938 [2];
  Packet2d local_928;
  double local_918 [2];
  Packet2d local_908;
  double local_8f8 [2];
  double local_8e8 [2];
  double local_8d8 [2];
  double local_8c8 [2];
  undefined1 auStack_8b8 [8];
  RhsPacket b0_1;
  long j_1;
  undefined1 auStack_898 [8];
  ResPacket c3_1;
  double local_880;
  undefined1 auStack_878 [8];
  ResPacket c2_1;
  double local_860;
  undefined1 auStack_858 [8];
  ResPacket c1_1;
  double local_840;
  undefined1 auStack_838 [8];
  ResPacket c0_1;
  Packet2d local_818;
  double local_808 [2];
  Packet2d local_7f8;
  double local_7e8 [2];
  Packet2d local_7d8;
  double local_7c8 [2];
  Packet2d local_7b8;
  double local_7a8 [2];
  Packet2d local_798;
  double local_788 [2];
  Packet2d local_778;
  double local_768 [2];
  Packet2d local_758;
  double local_748 [2];
  Packet2d local_738;
  double local_728 [2];
  double local_718 [2];
  double local_708 [2];
  double local_6f8 [2];
  double local_6e8 [2];
  double local_6d8 [2];
  double local_6c8 [2];
  double local_6b8 [2];
  undefined1 auStack_6a8 [8];
  RhsPacket b0;
  long j;
  undefined1 auStack_688 [8];
  ResPacket c7;
  double local_670;
  undefined1 auStack_668 [8];
  ResPacket c6;
  double local_650;
  undefined1 auStack_648 [8];
  ResPacket c5;
  double local_630;
  undefined1 auStack_628 [8];
  ResPacket c4;
  double local_610;
  undefined1 auStack_608 [8];
  ResPacket c3;
  double local_5f0;
  undefined1 auStack_5e8 [8];
  ResPacket c2;
  double local_5d0;
  undefined1 auStack_5c8 [8];
  ResPacket c1;
  double local_5b0;
  undefined1 auStack_5a8 [8];
  ResPacket c0;
  long i;
  long local_588;
  long jend;
  long j2;
  ResPacketQuarter palpha_quarter;
  ResPacketHalf palpha_half;
  ResPacket palpha;
  long block_cols;
  long n_quarter;
  long n_half;
  long n1;
  long n2;
  long n3;
  long n4;
  long n8;
  long lhsStride;
  undefined1 auStack_4f8 [4];
  conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
  pcj_quarter;
  conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
  pcj_half;
  conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
  pcj;
  conj_helper<double,_double,_false,_false> cj;
  const_blas_data_mapper<double,_long,_0> lhs;
  double alpha_local;
  long resIncr_local;
  ResScalar *res_local;
  const_blas_data_mapper<double,_long,_1> *rhs_local;
  const_blas_data_mapper<double,_long,_0> *alhs_local;
  long cols_local;
  long rows_local;
  long *local_4a8;
  undefined8 local_4a0;
  long local_498;
  ResScalar *local_490;
  undefined8 local_488;
  double local_480;
  ResScalar *local_478;
  undefined8 local_470;
  double local_468;
  ResScalar *local_460;
  undefined8 local_458;
  double local_450;
  ResScalar *local_448;
  undefined8 local_440;
  double local_438;
  ResScalar *local_430;
  undefined8 local_428;
  double local_420;
  ResScalar *local_418;
  double local_410;
  double local_408;
  undefined1 *local_400;
  double *local_3f8;
  double local_3f0;
  long local_3e8;
  undefined1 *local_3e0;
  double *local_3d8;
  double local_3d0;
  double local_3c8;
  undefined1 *local_3c0;
  double *local_3b8;
  double local_3b0;
  long local_3a8;
  undefined1 *local_3a0;
  double *local_398;
  double local_390;
  long local_388;
  undefined1 *local_380;
  double *local_378;
  double local_370;
  double local_368;
  undefined1 *local_360;
  double *local_358;
  double local_350;
  long local_348;
  undefined1 *local_340;
  double *local_338;
  double local_330;
  long local_328;
  undefined1 *local_320;
  double *local_318;
  double local_310;
  long local_308;
  undefined1 *local_300;
  double *local_2f8;
  double local_2f0;
  double local_2e8;
  undefined1 *local_2e0;
  double *local_2d8;
  double local_2d0;
  long local_2c8;
  undefined1 *local_2c0;
  double *local_2b8;
  double local_2b0;
  long local_2a8;
  undefined1 *local_2a0;
  double *local_298;
  double local_290;
  long local_288;
  undefined1 *local_280;
  double *local_278;
  double local_270;
  long local_268;
  undefined1 *local_260;
  double *local_258;
  double local_250;
  long local_248;
  undefined1 *local_240;
  double *local_238;
  double local_230;
  long local_228;
  undefined1 *local_220;
  double *local_218;
  double local_210;
  long local_208;
  undefined1 *local_200;
  double *local_1f8;
  double local_1f0;
  double local_1e8;
  undefined1 *local_1e0;
  double *local_1d8;
  double local_1d0;
  double local_1c8;
  undefined1 *local_1c0;
  double local_1b8;
  long local_1b0;
  undefined1 *local_1a8;
  double local_1a0;
  long local_198;
  undefined1 *local_190;
  double local_188;
  long local_180;
  undefined1 *local_178;
  double local_170;
  long local_168;
  undefined1 *local_160;
  double local_158;
  long local_150;
  undefined1 *local_148;
  double local_140;
  long local_138;
  undefined1 *local_130;
  double local_128;
  long local_120;
  undefined1 *local_118;
  double local_110;
  double local_108;
  undefined1 *local_100;
  double local_f8;
  long local_f0;
  undefined1 *local_e8;
  double local_e0;
  long local_d8;
  undefined1 *local_d0;
  double local_c8;
  long local_c0;
  undefined1 *local_b8;
  double local_b0;
  double local_a8;
  undefined1 *local_a0;
  double local_98;
  long local_90;
  undefined1 *local_88;
  double local_80;
  long local_78;
  undefined1 *local_70;
  double local_68;
  double local_60;
  undefined1 *local_58;
  double local_50;
  long local_48;
  undefined1 *local_40;
  double local_38;
  double local_30;
  undefined1 *local_28;
  long local_20;
  double local_18;
  undefined1 *local_10;
  
  lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = (long)alpha;
  alpha_local = (double)resIncr;
  resIncr_local = (long)res;
  res_local = (ResScalar *)rhs;
  rhs_local = (const_blas_data_mapper<double,_long,_1> *)alhs;
  alhs_local = (const_blas_data_mapper<double,_long,_0> *)cols;
  cols_local = rows;
  ignore_unused_variable<long>((long *)&alpha_local);
  _auStack_4f8 = (rhs_local->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data;
  lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
       (double *)(rhs_local->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
  lVar3 = blas_data_mapper<const_double,_long,_0,_0,_1>::stride
                    ((blas_data_mapper<const_double,_long,_0,_0,_1> *)auStack_4f8);
  lVar4 = cols_local + -0xf;
  lVar5 = cols_local + -7;
  lVar6 = cols_local + -5;
  lVar7 = cols_local + -3;
  lVar8 = cols_local + -1;
  if ((long)alhs_local < 0x80) {
    local_ba0 = alhs_local;
  }
  else {
    iVar2 = 4;
    if ((ulong)(lVar3 << 3) < 32000) {
      iVar2 = 0x10;
    }
    local_ba0 = (const_blas_data_mapper<double,_long,_0> *)(long)iVar2;
  }
  adVar11 = pset1<double__vector(2)>
                      ((double *)&lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride);
  unique0x10000508 = extraout_XMM0_Dc;
  palpha_half[1] = adVar11[0];
  unique0x1000050c = extraout_XMM0_Dd;
  adVar11 = pset1<double__vector(2)>
                      ((double *)&lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride);
  unique0x1000052c = extraout_XMM0_Dc_00;
  palpha_quarter[1] = adVar11[0];
  unique0x10000530 = extraout_XMM0_Dd_00;
  adVar11 = pset1<double__vector(2)>
                      ((double *)&lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride);
  unique0x10000550 = extraout_XMM0_Dc_01;
  j2 = adVar11[0];
  unique0x10000554 = extraout_XMM0_Dd_01;
  for (jend = 0; jend < (long)alhs_local;
      jend = (long)&(local_ba0->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data + jend)
  {
    i = (long)&(local_ba0->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data + jend;
    local_4a8 = &i;
    rows_local = (long)&alhs_local;
    plVar9 = std::min<long>(local_4a8,(long *)rows_local);
    local_588 = *plVar9;
    for (c0[1] = 0.0; (long)c0[1] < lVar4; c0[1] = (double)((long)c0[1] + 0x10)) {
      local_5b0 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_5b0);
      unique0x10000574 = extraout_XMM0_Dc_02;
      auStack_5a8 = adVar11[0];
      unique0x10000578 = extraout_XMM0_Dd_02;
      local_5d0 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_5d0);
      unique0x10000598 = extraout_XMM0_Dc_03;
      auStack_5c8 = adVar11[0];
      unique0x1000059c = extraout_XMM0_Dd_03;
      local_5f0 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_5f0);
      unique0x100005bc = extraout_XMM0_Dc_04;
      auStack_5e8 = adVar11[0];
      unique0x100005c0 = extraout_XMM0_Dd_04;
      local_610 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_610);
      unique0x100005e0 = extraout_XMM0_Dc_05;
      auStack_608 = adVar11[0];
      unique0x100005e4 = extraout_XMM0_Dd_05;
      local_630 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_630);
      unique0x10000604 = extraout_XMM0_Dc_06;
      auStack_628 = adVar11[0];
      unique0x10000608 = extraout_XMM0_Dd_06;
      local_650 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_650);
      unique0x10000628 = extraout_XMM0_Dc_07;
      auStack_648 = adVar11[0];
      unique0x1000062c = extraout_XMM0_Dd_07;
      local_670 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_670);
      unique0x1000064c = extraout_XMM0_Dc_08;
      auStack_668 = adVar11[0];
      unique0x10000650 = extraout_XMM0_Dd_08;
      j = 0;
      adVar11 = pset1<double__vector(2)>((double *)&j);
      unique0x10000670 = extraout_XMM0_Dc_09;
      auStack_688 = adVar11[0];
      unique0x10000674 = extraout_XMM0_Dd_09;
      for (b0[1] = (double)jend; (long)b0[1] < local_588; b0[1] = (double)((long)b0[1] + 1)) {
        local_418 = res_local;
        local_420 = b0[1];
        local_428 = 0;
        adVar11 = pset1<double__vector(2)>
                            ((double *)((long)*res_local + (long)b0[1] * (long)res_local[1] * 8));
        unique0x10000694 = extraout_XMM0_Dc_10;
        auStack_6a8 = adVar11[0];
        unique0x10000698 = extraout_XMM0_Dd_10;
        local_1e0 = auStack_4f8;
        local_1e8 = c0[1];
        local_1f0 = b0[1];
        local_1c8 = c0[1];
        local_1d0 = b0[1];
        local_1d8 = _auStack_4f8 +
                    (long)c0[1] +
                    (long)b0[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_1c0 = local_1e0;
        adVar11 = ploadu<double__vector(2)>(local_1d8);
        local_6b8[1]._0_4_ = extraout_XMM0_Dc_11;
        local_6b8[0] = adVar11[0];
        local_6b8[1]._4_4_ = extraout_XMM0_Dd_11;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_6b8,(double (*) [2])auStack_6a8,
                          (double (*) [2])auStack_5a8);
        unique0x100006dc = extraout_XMM0_Dc_12;
        auStack_5a8 = adVar12[0];
        unique0x100006e0 = extraout_XMM0_Dd_12;
        local_208 = (long)c0[1] + 2;
        local_200 = auStack_4f8;
        local_210 = b0[1];
        local_1b8 = b0[1];
        local_1f8 = _auStack_4f8 +
                    local_208 +
                    (long)b0[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_1b0 = local_208;
        local_1a8 = local_200;
        adVar11 = ploadu<double__vector(2)>(local_1f8);
        local_6c8[1]._0_4_ = extraout_XMM0_Dc_13;
        local_6c8[0] = adVar11[0];
        local_6c8[1]._4_4_ = extraout_XMM0_Dd_13;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_6c8,(double (*) [2])auStack_6a8,
                          (double (*) [2])auStack_5c8);
        unique0x10000724 = extraout_XMM0_Dc_14;
        auStack_5c8 = adVar12[0];
        unique0x10000728 = extraout_XMM0_Dd_14;
        local_228 = (long)c0[1] + 4;
        local_220 = auStack_4f8;
        local_230 = b0[1];
        local_1a0 = b0[1];
        local_218 = _auStack_4f8 +
                    local_228 +
                    (long)b0[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_198 = local_228;
        local_190 = local_220;
        adVar11 = ploadu<double__vector(2)>(local_218);
        local_6d8[1]._0_4_ = extraout_XMM0_Dc_15;
        local_6d8[0] = adVar11[0];
        local_6d8[1]._4_4_ = extraout_XMM0_Dd_15;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_6d8,(double (*) [2])auStack_6a8,
                          (double (*) [2])auStack_5e8);
        unique0x1000076c = extraout_XMM0_Dc_16;
        auStack_5e8 = adVar12[0];
        unique0x10000770 = extraout_XMM0_Dd_16;
        local_248 = (long)c0[1] + 6;
        local_240 = auStack_4f8;
        local_250 = b0[1];
        local_188 = b0[1];
        local_238 = _auStack_4f8 +
                    local_248 +
                    (long)b0[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_180 = local_248;
        local_178 = local_240;
        adVar11 = ploadu<double__vector(2)>(local_238);
        local_6e8[1]._0_4_ = extraout_XMM0_Dc_17;
        local_6e8[0] = adVar11[0];
        local_6e8[1]._4_4_ = extraout_XMM0_Dd_17;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_6e8,(double (*) [2])auStack_6a8,
                          (double (*) [2])auStack_608);
        unique0x100007b4 = extraout_XMM0_Dc_18;
        auStack_608 = adVar12[0];
        unique0x100007b8 = extraout_XMM0_Dd_18;
        local_268 = (long)c0[1] + 8;
        local_260 = auStack_4f8;
        local_270 = b0[1];
        local_170 = b0[1];
        local_258 = _auStack_4f8 +
                    local_268 +
                    (long)b0[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_168 = local_268;
        local_160 = local_260;
        adVar11 = ploadu<double__vector(2)>(local_258);
        local_6f8[1]._0_4_ = extraout_XMM0_Dc_19;
        local_6f8[0] = adVar11[0];
        local_6f8[1]._4_4_ = extraout_XMM0_Dd_19;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_6f8,(double (*) [2])auStack_6a8,
                          (double (*) [2])auStack_628);
        unique0x100007fc = extraout_XMM0_Dc_20;
        auStack_628 = adVar12[0];
        unique0x10000800 = extraout_XMM0_Dd_20;
        local_288 = (long)c0[1] + 10;
        local_280 = auStack_4f8;
        local_290 = b0[1];
        local_158 = b0[1];
        local_278 = _auStack_4f8 +
                    local_288 +
                    (long)b0[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_150 = local_288;
        local_148 = local_280;
        adVar11 = ploadu<double__vector(2)>(local_278);
        local_708[1]._0_4_ = extraout_XMM0_Dc_21;
        local_708[0] = adVar11[0];
        local_708[1]._4_4_ = extraout_XMM0_Dd_21;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_708,(double (*) [2])auStack_6a8,
                          (double (*) [2])auStack_648);
        unique0x10000844 = extraout_XMM0_Dc_22;
        auStack_648 = adVar12[0];
        unique0x10000848 = extraout_XMM0_Dd_22;
        local_2a8 = (long)c0[1] + 0xc;
        local_2a0 = auStack_4f8;
        local_2b0 = b0[1];
        local_140 = b0[1];
        local_298 = _auStack_4f8 +
                    local_2a8 +
                    (long)b0[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_138 = local_2a8;
        local_130 = local_2a0;
        adVar11 = ploadu<double__vector(2)>(local_298);
        local_718[1]._0_4_ = extraout_XMM0_Dc_23;
        local_718[0] = adVar11[0];
        local_718[1]._4_4_ = extraout_XMM0_Dd_23;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_718,(double (*) [2])auStack_6a8,
                          (double (*) [2])auStack_668);
        unique0x1000088c = extraout_XMM0_Dc_24;
        auStack_668 = adVar12[0];
        unique0x10000890 = extraout_XMM0_Dd_24;
        local_2c8 = (long)c0[1] + 0xe;
        local_2c0 = auStack_4f8;
        local_2d0 = b0[1];
        local_128 = b0[1];
        local_2b8 = _auStack_4f8 +
                    local_2c8 +
                    (long)b0[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_120 = local_2c8;
        local_118 = local_2c0;
        adVar11 = ploadu<double__vector(2)>(local_2b8);
        local_728[1]._0_4_ = extraout_XMM0_Dc_25;
        local_728[0] = adVar11[0];
        local_728[1]._4_4_ = extraout_XMM0_Dd_25;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_728,(double (*) [2])auStack_6a8,
                          (double (*) [2])auStack_688);
        unique0x100008d4 = extraout_XMM0_Dc_26;
        auStack_688 = adVar12[0];
        unique0x100008d8 = extraout_XMM0_Dd_26;
      }
      pdVar10 = (double *)(resIncr_local + (long)c0[1] * 8);
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8));
      local_748[1]._0_4_ = extraout_XMM0_Dc_27;
      local_748[0] = adVar11[0];
      local_748[1]._4_4_ = extraout_XMM0_Dd_27;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_5a8,(double (*) [2])(palpha_half + 1),&local_748)
      ;
      local_738[1]._0_4_ = extraout_XMM0_Dc_28;
      local_738[0] = adVar12[0];
      local_738[1]._4_4_ = extraout_XMM0_Dd_28;
      pstoreu<double,double__vector(2)>(pdVar10,&local_738);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x10));
      local_768[1]._0_4_ = extraout_XMM0_Dc_29;
      local_768[0] = adVar11[0];
      local_768[1]._4_4_ = extraout_XMM0_Dd_29;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_5c8,(double (*) [2])(palpha_half + 1),&local_768)
      ;
      local_758[1]._0_4_ = extraout_XMM0_Dc_30;
      local_758[0] = adVar12[0];
      local_758[1]._4_4_ = extraout_XMM0_Dd_30;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x10),&local_758);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x20));
      local_788[1]._0_4_ = extraout_XMM0_Dc_31;
      local_788[0] = adVar11[0];
      local_788[1]._4_4_ = extraout_XMM0_Dd_31;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_5e8,(double (*) [2])(palpha_half + 1),&local_788)
      ;
      local_778[1]._0_4_ = extraout_XMM0_Dc_32;
      local_778[0] = adVar12[0];
      local_778[1]._4_4_ = extraout_XMM0_Dd_32;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x20),&local_778);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x30));
      local_7a8[1]._0_4_ = extraout_XMM0_Dc_33;
      local_7a8[0] = adVar11[0];
      local_7a8[1]._4_4_ = extraout_XMM0_Dd_33;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_608,(double (*) [2])(palpha_half + 1),&local_7a8)
      ;
      local_798[1]._0_4_ = extraout_XMM0_Dc_34;
      local_798[0] = adVar12[0];
      local_798[1]._4_4_ = extraout_XMM0_Dd_34;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x30),&local_798);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x40));
      local_7c8[1]._0_4_ = extraout_XMM0_Dc_35;
      local_7c8[0] = adVar11[0];
      local_7c8[1]._4_4_ = extraout_XMM0_Dd_35;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_628,(double (*) [2])(palpha_half + 1),&local_7c8)
      ;
      local_7b8[1]._0_4_ = extraout_XMM0_Dc_36;
      local_7b8[0] = adVar12[0];
      local_7b8[1]._4_4_ = extraout_XMM0_Dd_36;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x40),&local_7b8);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x50));
      local_7e8[1]._0_4_ = extraout_XMM0_Dc_37;
      local_7e8[0] = adVar11[0];
      local_7e8[1]._4_4_ = extraout_XMM0_Dd_37;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_648,(double (*) [2])(palpha_half + 1),&local_7e8)
      ;
      local_7d8[1]._0_4_ = extraout_XMM0_Dc_38;
      local_7d8[0] = adVar12[0];
      local_7d8[1]._4_4_ = extraout_XMM0_Dd_38;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x50),&local_7d8);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x60));
      local_808[1]._0_4_ = extraout_XMM0_Dc_39;
      local_808[0] = adVar11[0];
      local_808[1]._4_4_ = extraout_XMM0_Dd_39;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_668,(double (*) [2])(palpha_half + 1),&local_808)
      ;
      local_7f8[1]._0_4_ = extraout_XMM0_Dc_40;
      local_7f8[0] = adVar12[0];
      local_7f8[1]._4_4_ = extraout_XMM0_Dd_40;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x60),&local_7f8);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x70));
      unique0x10000af0 = extraout_XMM0_Dc_41;
      c0_1[1] = adVar11[0];
      unique0x10000af4 = extraout_XMM0_Dd_41;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_688,(double (*) [2])(palpha_half + 1),
                           (double (*) [2])(c0_1 + 1));
      local_818[1]._0_4_ = extraout_XMM0_Dc_42;
      local_818[0] = adVar12[0];
      local_818[1]._4_4_ = extraout_XMM0_Dd_42;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x70),&local_818);
    }
    if ((long)c0[1] < lVar5) {
      local_840 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_840);
      unique0x10000b38 = extraout_XMM0_Dc_43;
      auStack_838 = adVar11[0];
      unique0x10000b3c = extraout_XMM0_Dd_43;
      local_860 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_860);
      unique0x10000b5c = extraout_XMM0_Dc_44;
      auStack_858 = adVar11[0];
      unique0x10000b60 = extraout_XMM0_Dd_44;
      local_880 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_880);
      unique0x10000b80 = extraout_XMM0_Dc_45;
      auStack_878 = adVar11[0];
      unique0x10000b84 = extraout_XMM0_Dd_45;
      j_1 = 0;
      adVar11 = pset1<double__vector(2)>((double *)&j_1);
      unique0x10000ba4 = extraout_XMM0_Dc_46;
      auStack_898 = adVar11[0];
      unique0x10000ba8 = extraout_XMM0_Dd_46;
      for (b0_1[1] = (double)jend; (long)b0_1[1] < local_588; b0_1[1] = (double)((long)b0_1[1] + 1))
      {
        local_430 = res_local;
        local_438 = b0_1[1];
        local_440 = 0;
        adVar11 = pset1<double__vector(2)>
                            ((double *)((long)*res_local + (long)b0_1[1] * (long)res_local[1] * 8));
        unique0x10000bc8 = extraout_XMM0_Dc_47;
        auStack_8b8 = adVar11[0];
        unique0x10000bcc = extraout_XMM0_Dd_47;
        local_2e0 = auStack_4f8;
        local_2e8 = c0[1];
        local_2f0 = b0_1[1];
        local_108 = c0[1];
        local_110 = b0_1[1];
        local_2d8 = _auStack_4f8 +
                    (long)c0[1] +
                    (long)b0_1[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_100 = local_2e0;
        adVar11 = ploadu<double__vector(2)>(local_2d8);
        local_8c8[1]._0_4_ = extraout_XMM0_Dc_48;
        local_8c8[0] = adVar11[0];
        local_8c8[1]._4_4_ = extraout_XMM0_Dd_48;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_8c8,(double (*) [2])auStack_8b8,
                          (double (*) [2])auStack_838);
        unique0x10000c10 = extraout_XMM0_Dc_49;
        auStack_838 = adVar12[0];
        unique0x10000c14 = extraout_XMM0_Dd_49;
        local_308 = (long)c0[1] + 2;
        local_300 = auStack_4f8;
        local_310 = b0_1[1];
        local_f8 = b0_1[1];
        local_2f8 = _auStack_4f8 +
                    local_308 +
                    (long)b0_1[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_f0 = local_308;
        local_e8 = local_300;
        adVar11 = ploadu<double__vector(2)>(local_2f8);
        local_8d8[1]._0_4_ = extraout_XMM0_Dc_50;
        local_8d8[0] = adVar11[0];
        local_8d8[1]._4_4_ = extraout_XMM0_Dd_50;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_8d8,(double (*) [2])auStack_8b8,
                          (double (*) [2])auStack_858);
        unique0x10000c58 = extraout_XMM0_Dc_51;
        auStack_858 = adVar12[0];
        unique0x10000c5c = extraout_XMM0_Dd_51;
        local_328 = (long)c0[1] + 4;
        local_320 = auStack_4f8;
        local_330 = b0_1[1];
        local_e0 = b0_1[1];
        local_318 = _auStack_4f8 +
                    local_328 +
                    (long)b0_1[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_d8 = local_328;
        local_d0 = local_320;
        adVar11 = ploadu<double__vector(2)>(local_318);
        local_8e8[1]._0_4_ = extraout_XMM0_Dc_52;
        local_8e8[0] = adVar11[0];
        local_8e8[1]._4_4_ = extraout_XMM0_Dd_52;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_8e8,(double (*) [2])auStack_8b8,
                          (double (*) [2])auStack_878);
        unique0x10000ca0 = extraout_XMM0_Dc_53;
        auStack_878 = adVar12[0];
        unique0x10000ca4 = extraout_XMM0_Dd_53;
        local_348 = (long)c0[1] + 6;
        local_340 = auStack_4f8;
        local_350 = b0_1[1];
        local_c8 = b0_1[1];
        local_338 = _auStack_4f8 +
                    local_348 +
                    (long)b0_1[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_c0 = local_348;
        local_b8 = local_340;
        adVar11 = ploadu<double__vector(2)>(local_338);
        local_8f8[1]._0_4_ = extraout_XMM0_Dc_54;
        local_8f8[0] = adVar11[0];
        local_8f8[1]._4_4_ = extraout_XMM0_Dd_54;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_8f8,(double (*) [2])auStack_8b8,
                          (double (*) [2])auStack_898);
        unique0x10000ce8 = extraout_XMM0_Dc_55;
        auStack_898 = adVar12[0];
        unique0x10000cec = extraout_XMM0_Dd_55;
      }
      pdVar10 = (double *)(resIncr_local + (long)c0[1] * 8);
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8));
      local_918[1]._0_4_ = extraout_XMM0_Dc_56;
      local_918[0] = adVar11[0];
      local_918[1]._4_4_ = extraout_XMM0_Dd_56;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_838,(double (*) [2])(palpha_half + 1),&local_918)
      ;
      local_908[1]._0_4_ = extraout_XMM0_Dc_57;
      local_908[0] = adVar12[0];
      local_908[1]._4_4_ = extraout_XMM0_Dd_57;
      pstoreu<double,double__vector(2)>(pdVar10,&local_908);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x10));
      local_938[1]._0_4_ = extraout_XMM0_Dc_58;
      local_938[0] = adVar11[0];
      local_938[1]._4_4_ = extraout_XMM0_Dd_58;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_858,(double (*) [2])(palpha_half + 1),&local_938)
      ;
      local_928[1]._0_4_ = extraout_XMM0_Dc_59;
      local_928[0] = adVar12[0];
      local_928[1]._4_4_ = extraout_XMM0_Dd_59;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x10),&local_928);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x20));
      local_958[1]._0_4_ = extraout_XMM0_Dc_60;
      local_958[0] = adVar11[0];
      local_958[1]._4_4_ = extraout_XMM0_Dd_60;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_878,(double (*) [2])(palpha_half + 1),&local_958)
      ;
      local_948[1]._0_4_ = extraout_XMM0_Dc_61;
      local_948[0] = adVar12[0];
      local_948[1]._4_4_ = extraout_XMM0_Dd_61;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x20),&local_948);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x30));
      unique0x10000de4 = extraout_XMM0_Dc_62;
      c0_2[1] = adVar11[0];
      unique0x10000de8 = extraout_XMM0_Dd_62;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_898,(double (*) [2])(palpha_half + 1),
                           (double (*) [2])(c0_2 + 1));
      local_968[1]._0_4_ = extraout_XMM0_Dc_63;
      local_968[0] = adVar12[0];
      local_968[1]._4_4_ = extraout_XMM0_Dd_63;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x30),&local_968);
      c0[1] = (double)((long)c0[1] + 8);
    }
    if ((long)c0[1] < lVar6) {
      local_990 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_990);
      unique0x10000e2c = extraout_XMM0_Dc_64;
      auStack_988 = adVar11[0];
      unique0x10000e30 = extraout_XMM0_Dd_64;
      local_9b0 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_9b0);
      unique0x10000e50 = extraout_XMM0_Dc_65;
      auStack_9a8 = adVar11[0];
      unique0x10000e54 = extraout_XMM0_Dd_65;
      j_2 = 0;
      adVar11 = pset1<double__vector(2)>((double *)&j_2);
      unique0x10000e74 = extraout_XMM0_Dc_66;
      auStack_9c8 = adVar11[0];
      unique0x10000e78 = extraout_XMM0_Dd_66;
      for (b0_2[1] = (double)jend; (long)b0_2[1] < local_588; b0_2[1] = (double)((long)b0_2[1] + 1))
      {
        local_448 = res_local;
        local_450 = b0_2[1];
        local_458 = 0;
        adVar11 = pset1<double__vector(2)>
                            ((double *)((long)*res_local + (long)b0_2[1] * (long)res_local[1] * 8));
        unique0x10000e98 = extraout_XMM0_Dc_67;
        auStack_9e8 = adVar11[0];
        unique0x10000e9c = extraout_XMM0_Dd_67;
        local_360 = auStack_4f8;
        local_368 = c0[1];
        local_370 = b0_2[1];
        local_a8 = c0[1];
        local_b0 = b0_2[1];
        local_358 = _auStack_4f8 +
                    (long)c0[1] +
                    (long)b0_2[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_a0 = local_360;
        adVar11 = ploadu<double__vector(2)>(local_358);
        local_9f8[1]._0_4_ = extraout_XMM0_Dc_68;
        local_9f8[0] = adVar11[0];
        local_9f8[1]._4_4_ = extraout_XMM0_Dd_68;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_9f8,(double (*) [2])auStack_9e8,
                          (double (*) [2])auStack_988);
        unique0x10000ee0 = extraout_XMM0_Dc_69;
        auStack_988 = adVar12[0];
        unique0x10000ee4 = extraout_XMM0_Dd_69;
        local_388 = (long)c0[1] + 2;
        local_380 = auStack_4f8;
        local_390 = b0_2[1];
        local_98 = b0_2[1];
        local_378 = _auStack_4f8 +
                    local_388 +
                    (long)b0_2[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_90 = local_388;
        local_88 = local_380;
        adVar11 = ploadu<double__vector(2)>(local_378);
        local_a08[1]._0_4_ = extraout_XMM0_Dc_70;
        local_a08[0] = adVar11[0];
        local_a08[1]._4_4_ = extraout_XMM0_Dd_70;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_a08,(double (*) [2])auStack_9e8,
                          (double (*) [2])auStack_9a8);
        unique0x10000f28 = extraout_XMM0_Dc_71;
        auStack_9a8 = adVar12[0];
        unique0x10000f2c = extraout_XMM0_Dd_71;
        local_3a8 = (long)c0[1] + 4;
        local_3a0 = auStack_4f8;
        local_3b0 = b0_2[1];
        local_80 = b0_2[1];
        local_398 = _auStack_4f8 +
                    local_3a8 +
                    (long)b0_2[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_78 = local_3a8;
        local_70 = local_3a0;
        adVar11 = ploadu<double__vector(2)>(local_398);
        local_a18[1]._0_4_ = extraout_XMM0_Dc_72;
        local_a18[0] = adVar11[0];
        local_a18[1]._4_4_ = extraout_XMM0_Dd_72;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_a18,(double (*) [2])auStack_9e8,
                          (double (*) [2])auStack_9c8);
        unique0x10000f70 = extraout_XMM0_Dc_73;
        auStack_9c8 = adVar12[0];
        unique0x10000f74 = extraout_XMM0_Dd_73;
      }
      pdVar10 = (double *)(resIncr_local + (long)c0[1] * 8);
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8));
      local_a38[1]._0_4_ = extraout_XMM0_Dc_74;
      local_a38[0] = adVar11[0];
      local_a38[1]._4_4_ = extraout_XMM0_Dd_74;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_988,(double (*) [2])(palpha_half + 1),&local_a38)
      ;
      local_a28[1]._0_4_ = extraout_XMM0_Dc_75;
      local_a28[0] = adVar12[0];
      local_a28[1]._4_4_ = extraout_XMM0_Dd_75;
      pstoreu<double,double__vector(2)>(pdVar10,&local_a28);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x10));
      local_a58[1]._0_4_ = extraout_XMM0_Dc_76;
      local_a58[0] = adVar11[0];
      local_a58[1]._4_4_ = extraout_XMM0_Dd_76;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_9a8,(double (*) [2])(palpha_half + 1),&local_a58)
      ;
      local_a48[1]._0_4_ = extraout_XMM0_Dc_77;
      local_a48[0] = adVar12[0];
      local_a48[1]._4_4_ = extraout_XMM0_Dd_77;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x10),&local_a48);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x20));
      unique0x10001024 = extraout_XMM0_Dc_78;
      c0_3[1] = adVar11[0];
      unique0x10001028 = extraout_XMM0_Dd_78;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_9c8,(double (*) [2])(palpha_half + 1),
                           (double (*) [2])(c0_3 + 1));
      local_a68[1]._0_4_ = extraout_XMM0_Dc_79;
      local_a68[0] = adVar12[0];
      local_a68[1]._4_4_ = extraout_XMM0_Dd_79;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x20),&local_a68);
      c0[1] = (double)((long)c0[1] + 6);
    }
    if ((long)c0[1] < lVar7) {
      local_a90 = 0.0;
      adVar11 = pset1<double__vector(2)>(&local_a90);
      unique0x1000106c = extraout_XMM0_Dc_80;
      auStack_a88 = adVar11[0];
      unique0x10001070 = extraout_XMM0_Dd_80;
      j_3 = 0;
      adVar11 = pset1<double__vector(2)>((double *)&j_3);
      unique0x10001090 = extraout_XMM0_Dc_81;
      auStack_aa8 = adVar11[0];
      unique0x10001094 = extraout_XMM0_Dd_81;
      for (b0_3[1] = (double)jend; (long)b0_3[1] < local_588; b0_3[1] = (double)((long)b0_3[1] + 1))
      {
        local_460 = res_local;
        local_468 = b0_3[1];
        local_470 = 0;
        adVar11 = pset1<double__vector(2)>
                            ((double *)((long)*res_local + (long)b0_3[1] * (long)res_local[1] * 8));
        unique0x100010b4 = extraout_XMM0_Dc_82;
        auStack_ac8 = adVar11[0];
        unique0x100010b8 = extraout_XMM0_Dd_82;
        local_3c0 = auStack_4f8;
        local_3c8 = c0[1];
        local_3d0 = b0_3[1];
        local_60 = c0[1];
        local_68 = b0_3[1];
        local_3b8 = _auStack_4f8 +
                    (long)c0[1] +
                    (long)b0_3[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_58 = local_3c0;
        adVar11 = ploadu<double__vector(2)>(local_3b8);
        local_ad8[1]._0_4_ = extraout_XMM0_Dc_83;
        local_ad8[0] = adVar11[0];
        local_ad8[1]._4_4_ = extraout_XMM0_Dd_83;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_ad8,(double (*) [2])auStack_ac8,
                          (double (*) [2])auStack_a88);
        unique0x100010fc = extraout_XMM0_Dc_84;
        auStack_a88 = adVar12[0];
        unique0x10001100 = extraout_XMM0_Dd_84;
        local_3e8 = (long)c0[1] + 2;
        local_3e0 = auStack_4f8;
        local_3f0 = b0_3[1];
        local_50 = b0_3[1];
        local_3d8 = _auStack_4f8 +
                    local_3e8 +
                    (long)b0_3[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_48 = local_3e8;
        local_40 = local_3e0;
        adVar11 = ploadu<double__vector(2)>(local_3d8);
        local_ae8[1]._0_4_ = extraout_XMM0_Dc_85;
        local_ae8[0] = adVar11[0];
        local_ae8[1]._4_4_ = extraout_XMM0_Dd_85;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_ae8,(double (*) [2])auStack_ac8,
                          (double (*) [2])auStack_aa8);
        unique0x10001144 = extraout_XMM0_Dc_86;
        auStack_aa8 = adVar12[0];
        unique0x10001148 = extraout_XMM0_Dd_86;
      }
      pdVar10 = (double *)(resIncr_local + (long)c0[1] * 8);
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8));
      local_b08[1]._0_4_ = extraout_XMM0_Dc_87;
      local_b08[0] = adVar11[0];
      local_b08[1]._4_4_ = extraout_XMM0_Dd_87;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_a88,(double (*) [2])(palpha_half + 1),&local_b08)
      ;
      local_af8[1]._0_4_ = extraout_XMM0_Dc_88;
      local_af8[0] = adVar12[0];
      local_af8[1]._4_4_ = extraout_XMM0_Dd_88;
      pstoreu<double,double__vector(2)>(pdVar10,&local_af8);
      lVar3 = resIncr_local + (long)c0[1] * 8;
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8 + 0x10));
      unique0x100011b0 = extraout_XMM0_Dc_89;
      c0_4[1] = adVar11[0];
      unique0x100011b4 = extraout_XMM0_Dd_89;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_aa8,(double (*) [2])(palpha_half + 1),
                           (double (*) [2])(c0_4 + 1));
      local_b18[1]._0_4_ = extraout_XMM0_Dc_90;
      local_b18[0] = adVar12[0];
      local_b18[1]._4_4_ = extraout_XMM0_Dd_90;
      pstoreu<double,double__vector(2)>((double *)(lVar3 + 0x10),&local_b18);
      c0[1] = (double)((long)c0[1] + 4);
    }
    if ((long)c0[1] < lVar8) {
      j_4 = 0;
      adVar11 = pset1<double__vector(2)>((double *)&j_4);
      unique0x100011f8 = extraout_XMM0_Dc_91;
      auStack_b38 = adVar11[0];
      unique0x100011fc = extraout_XMM0_Dd_91;
      for (b0_4[1] = (double)jend; (long)b0_4[1] < local_588; b0_4[1] = (double)((long)b0_4[1] + 1))
      {
        local_478 = res_local;
        local_480 = b0_4[1];
        local_488 = 0;
        adVar11 = pset1<double__vector(2)>
                            ((double *)((long)*res_local + (long)b0_4[1] * (long)res_local[1] * 8));
        unique0x1000121c = extraout_XMM0_Dc_92;
        auStack_b58 = adVar11[0];
        unique0x10001220 = extraout_XMM0_Dd_92;
        local_400 = auStack_4f8;
        local_408 = c0[1];
        local_410 = b0_4[1];
        local_30 = c0[1];
        local_38 = b0_4[1];
        local_3f8 = _auStack_4f8 +
                    (long)c0[1] +
                    (long)b0_4[1] *
                    (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        local_28 = local_400;
        adVar11 = ploadu<double__vector(2)>(local_3f8);
        local_b68[1]._0_4_ = extraout_XMM0_Dc_93;
        local_b68[0] = adVar11[0];
        local_b68[1]._4_4_ = extraout_XMM0_Dd_93;
        adVar12 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&lhsStride + 6),&local_b68,(double (*) [2])auStack_b58,
                          (double (*) [2])auStack_b38);
        unique0x10001264 = extraout_XMM0_Dc_94;
        auStack_b38 = adVar12[0];
        unique0x10001268 = extraout_XMM0_Dd_94;
      }
      pdVar10 = (double *)(resIncr_local + (long)c0[1] * 8);
      adVar11 = ploadu<double__vector(2)>((double *)(resIncr_local + (long)c0[1] * 8));
      unique0x10001288 = extraout_XMM0_Dc_95;
      c0_5 = adVar11[0];
      unique0x1000128c = extraout_XMM0_Dd_95;
      adVar12 = pmadd<double__vector(2)>
                          ((double (*) [2])auStack_b38,(double (*) [2])(palpha_half + 1),
                           (double (*) [2])&c0_5);
      local_b78[1]._0_4_ = extraout_XMM0_Dc_96;
      local_b78[0] = adVar12[0];
      local_b78[1]._4_4_ = extraout_XMM0_Dd_96;
      pstoreu<double,double__vector(2)>(pdVar10,&local_b78);
      c0[1] = (double)((long)c0[1] + 2);
    }
    for (; (long)c0[1] < cols_local; c0[1] = (double)((long)c0[1] + 1)) {
      j_5 = 0;
      for (local_b98 = jend; local_b98 < local_588; local_b98 = local_b98 + 1) {
        local_10 = auStack_4f8;
        local_18 = c0[1];
        local_20 = local_b98;
        local_490 = res_local;
        local_498 = local_b98;
        local_4a0 = 0;
        dVar1 = conj_helper<double,_double,_false,_false>::pmul
                          ((conj_helper<double,_double,_false,_false> *)((long)&lhsStride + 7),
                           _auStack_4f8 +
                           (long)c0[1] +
                           local_b98 *
                           (long)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data,
                           (double *)((long)*res_local + local_b98 * (long)res_local[1] * 8));
        j_5 = (long)(dVar1 + (double)j_5);
      }
      *(double *)(resIncr_local + (long)c0[1] * 8) =
           (double)lhs.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride * (double)j_5 +
           *(double *)(resIncr_local + (long)c0[1] * 8);
    }
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
        ResScalar* res, Index resIncr,
  RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr);
  eigen_internal_assert(resIncr==1);

  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  const Index lhsStride = lhs.stride();
  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  const Index n8 = rows-8*ResPacketSize+1;
  const Index n4 = rows-4*ResPacketSize+1;
  const Index n3 = rows-3*ResPacketSize+1;
  const Index n2 = rows-2*ResPacketSize+1;
  const Index n1 = rows-1*ResPacketSize+1;
  const Index n_half = rows-1*ResPacketSizeHalf+1;
  const Index n_quarter = rows-1*ResPacketSizeQuarter+1;

  // TODO: improve the following heuristic:
  const Index block_cols = cols<128 ? cols : (lhsStride*sizeof(LhsScalar)<32000?16:4);
  ResPacket palpha = pset1<ResPacket>(alpha);
  ResPacketHalf palpha_half = pset1<ResPacketHalf>(alpha);
  ResPacketQuarter palpha_quarter = pset1<ResPacketQuarter>(alpha);

  for(Index j2=0; j2<cols; j2+=block_cols)
  {
    Index jend = numext::mini(j2+block_cols,cols);
    Index i=0;
    for(; i<n8; i+=ResPacketSize*8)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0)),
                c4 = pset1<ResPacket>(ResScalar(0)),
                c5 = pset1<ResPacket>(ResScalar(0)),
                c6 = pset1<ResPacket>(ResScalar(0)),
                c7 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
        c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*4,j),b0,c4);
        c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*5,j),b0,c5);
        c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*6,j),b0,c6);
        c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*7,j),b0,c7);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));
      pstoreu(res+i+ResPacketSize*4, pmadd(c4,palpha,ploadu<ResPacket>(res+i+ResPacketSize*4)));
      pstoreu(res+i+ResPacketSize*5, pmadd(c5,palpha,ploadu<ResPacket>(res+i+ResPacketSize*5)));
      pstoreu(res+i+ResPacketSize*6, pmadd(c6,palpha,ploadu<ResPacket>(res+i+ResPacketSize*6)));
      pstoreu(res+i+ResPacketSize*7, pmadd(c7,palpha,ploadu<ResPacket>(res+i+ResPacketSize*7)));
    }
    if(i<n4)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));

      i+=ResPacketSize*4;
    }
    if(i<n3)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));

      i+=ResPacketSize*3;
    }
    if(i<n2)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      i+=ResPacketSize*2;
    }
    if(i<n1)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      i+=ResPacketSize;
    }
    if(HasHalf && i<n_half)
    {
      ResPacketHalf c0 = pset1<ResPacketHalf>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketHalf b0 = pset1<RhsPacketHalf>(rhs(j,0));
        c0 = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeHalf*0, pmadd(c0,palpha_half,ploadu<ResPacketHalf>(res+i+ResPacketSizeHalf*0)));
      i+=ResPacketSizeHalf;
    }
    if(HasQuarter && i<n_quarter)
    {
      ResPacketQuarter c0 = pset1<ResPacketQuarter>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketQuarter b0 = pset1<RhsPacketQuarter>(rhs(j,0));
        c0 = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeQuarter*0, pmadd(c0,palpha_quarter,ploadu<ResPacketQuarter>(res+i+ResPacketSizeQuarter*0)));
      i+=ResPacketSizeQuarter;
    }
    for(;i<rows;++i)
    {
      ResScalar c0(0);
      for(Index j=j2; j<jend; j+=1)
        c0 += cj.pmul(lhs(i,j), rhs(j,0));
      res[i] += alpha*c0;
    }
  }
}